

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DFA.hpp
# Opt level: O2

int __thiscall
Centaurus::DFA<unsigned_char>::add_state
          (DFA<unsigned_char> *this,set<int,_std::less<int>,_std::allocator<int>_> *label,
          bool long_flag)

{
  _Rb_tree_header *b;
  byte *pbVar1;
  pointer pDVar2;
  int *__first2;
  bool bVar3;
  undefined7 in_register_00000011;
  ulong uVar4;
  bool long_flag_local;
  undefined4 local_5c;
  vector<Centaurus::DFAState<unsigned_char>,std::allocator<Centaurus::DFAState<unsigned_char>>>
  *local_58;
  IndexVector local_50;
  
  local_58 = (vector<Centaurus::DFAState<unsigned_char>,std::allocator<Centaurus::DFAState<unsigned_char>>>
              *)&(this->super_NFABase<Centaurus::DFAState<unsigned_char>_>).m_states;
  b = &(label->_M_t)._M_impl.super__Rb_tree_header;
  uVar4 = 0;
  local_5c = (undefined4)CONCAT71(in_register_00000011,long_flag);
  long_flag_local = long_flag;
  while( true ) {
    pDVar2 = (this->super_NFABase<Centaurus::DFAState<unsigned_char>_>).m_states.
             super__Vector_base<Centaurus::DFAState<unsigned_char>,_std::allocator<Centaurus::DFAState<unsigned_char>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if ((ulong)(((long)(this->super_NFABase<Centaurus::DFAState<unsigned_char>_>).m_states.
                       super__Vector_base<Centaurus::DFAState<unsigned_char>,_std::allocator<Centaurus::DFAState<unsigned_char>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish - (long)pDVar2) / 0x48) <= uVar4)
    {
      IndexVector::IndexVector<std::_Rb_tree_const_iterator<int>>
                (&local_50,(label->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left,
                 (_Rb_tree_const_iterator<int>)b);
      std::
      vector<Centaurus::DFAState<unsigned_char>,std::allocator<Centaurus::DFAState<unsigned_char>>>
      ::emplace_back<Centaurus::IndexVector,bool&>(local_58,&local_50,&long_flag_local);
      std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                (&local_50.super_vector<int,_std::allocator<int>_>.
                  super__Vector_base<int,_std::allocator<int>_>);
      return (int)(((long)(this->super_NFABase<Centaurus::DFAState<unsigned_char>_>).m_states.
                          super__Vector_base<Centaurus::DFAState<unsigned_char>,_std::allocator<Centaurus::DFAState<unsigned_char>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                   (long)(this->super_NFABase<Centaurus::DFAState<unsigned_char>_>).m_states.
                         super__Vector_base<Centaurus::DFAState<unsigned_char>,_std::allocator<Centaurus::DFAState<unsigned_char>_>_>
                         ._M_impl.super__Vector_impl_data._M_start) / 0x48) + -1;
    }
    __first2 = pDVar2[uVar4].super_NFABaseState<unsigned_char,_Centaurus::IndexVector>.m_label.
               super_vector<int,_std::allocator<int>_>.super__Vector_base<int,_std::allocator<int>_>
               ._M_impl.super__Vector_impl_data._M_start;
    if (((label->_M_t)._M_impl.super__Rb_tree_header._M_node_count ==
         (long)*(pointer *)
                ((long)&pDVar2[uVar4].super_NFABaseState<unsigned_char,_Centaurus::IndexVector>.
                        m_label.super_vector<int,_std::allocator<int>_> + 8) - (long)__first2 >> 2)
       && (bVar3 = std::__equal<false>::equal<std::_Rb_tree_const_iterator<int>,int_const*>
                             ((label->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left,
                              (_Rb_tree_const_iterator<int>)b,__first2), bVar3)) break;
    uVar4 = (ulong)((int)uVar4 + 1);
  }
  pbVar1 = (byte *)(*(long *)local_58 + 0x40 + uVar4 * 0x48);
  *pbVar1 = *pbVar1 | (byte)local_5c;
  return (int)uVar4;
}

Assistant:

int add_state(const std::set<int>& label, bool long_flag = false)
	{
		for (unsigned int i = 0; i < m_states.size(); i++)
		{
			if (label.size() == m_states[i].label().size() && std::equal(label.cbegin(), label.cend(), m_states[i].label().cbegin()))
			{
                m_states[i].set_long(long_flag);
				return i;
			}
		}
		m_states.emplace_back(IndexVector(label.cbegin(), label.cend()), long_flag);
		return m_states.size() - 1;
	}